

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_resize2.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char *pcVar15;
  undefined8 in_XMM1_Qa;
  _Bool redraw;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_DISPLAY *display;
  int local_70 [2];
  undefined8 local_68;
  int local_50;
  int local_4c;
  undefined8 local_28;
  long lVar16;
  
  uVar9 = al_install_system(0x5020700,atexit);
  if ((uVar9 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_init_image_addon();
  al_init_font_addon();
  al_set_new_display_flags(0x50);
  lVar10 = al_create_display(0x280,0x1e0);
  if (lVar10 == 0) {
    abort_example("Unable to set any graphic mode\n");
  }
  al_set_new_bitmap_flags(1);
  lVar11 = al_load_bitmap("data/mysha.pcx");
  if (lVar11 == 0) {
    abort_example("Unable to load image\n");
  }
  uVar12 = al_create_builtin_font();
  uVar13 = al_create_event_queue();
  local_28 = uVar13;
  uVar14 = al_get_display_event_source(lVar10);
  al_register_event_source(uVar13,uVar14);
  uVar13 = local_28;
  uVar14 = al_get_keyboard_event_source();
  al_register_event_source(uVar13,uVar14);
  bVar1 = true;
  do {
    if ((bVar1) && (uVar9 = al_is_event_queue_empty(local_28), (uVar9 & 1) != 0)) {
      uVar13 = al_map_rgb(0xff,0);
      al_clear_to_color(uVar13,in_XMM1_Qa);
      lVar16 = lVar11;
      iVar2 = al_get_bitmap_width();
      iVar3 = al_get_bitmap_height(lVar16);
      iVar4 = al_get_display_width(lVar10);
      iVar5 = al_get_display_height(lVar10);
      in_XMM1_Qa = 0;
      al_draw_scaled_bitmap(0,0,(float)iVar2,(float)iVar3,0,0,(float)iVar4,(float)iVar5,lVar11,0);
      uVar13 = al_map_rgb(0xff,0xff,0);
      al_get_font_line_height(uVar12);
      uVar6 = al_get_display_width(lVar10);
      uVar7 = al_get_display_height(lVar10);
      uVar8 = al_get_display_flags(lVar10);
      pcVar15 = "no";
      if ((uVar8 & 0x2000) != 0) {
        pcVar15 = "yes";
      }
      al_draw_multiline_textf
                (uVar13,in_XMM1_Qa,0,0,0x44200000,uVar12,0,
                 "size: %d x %d\nmaximized: %s\n+ key to maximize\n- key to un-maximize",uVar6,uVar7
                 ,pcVar15);
      al_flip_display();
      bVar1 = false;
      lVar11 = lVar16;
    }
    al_wait_for_event(local_28,local_70);
    if (local_70[0] == 0x29) {
      al_acknowledge_resize(local_68);
      bVar1 = true;
    }
    if (local_70[0] == 0x28) {
      bVar1 = true;
    }
    if ((local_70[0] == 10) && (local_50 == 0x3b)) break;
    if ((local_70[0] == 0xb) && (local_4c == 0x2b)) {
      al_set_display_flag(lVar10,0x2000,1);
    }
    if ((local_70[0] == 0xb) && (local_4c == 0x2d)) {
      al_set_display_flag(lVar10,0x2000,0);
    }
  } while (local_70[0] != 0x2a);
  al_destroy_bitmap(lVar11);
  al_destroy_display(lVar10);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   ALLEGRO_FONT *font;
   bool redraw;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);
      al_draw_multiline_textf(font, al_map_rgb(255, 255, 0), 0, 0, 640,
         al_get_font_line_height(font), 0,
         "size: %d x %d\n"
         "maximized: %s\n"
         "+ key to maximize\n"
         "- key to un-maximize",
         al_get_display_width(display),
         al_get_display_height(display),
         al_get_display_flags(display) & ALLEGRO_MAXIMIZED ? "yes" :
         "no");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
            event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '+') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, true);
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '-') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, false);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;

}